

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

QStringList * __thiscall ProStringList::toQStringList(ProStringList *this)

{
  bool bVar1;
  const_iterator o;
  QList<ProString> *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProString *e;
  ProStringList *__range1;
  QStringList *ret;
  const_iterator __end1;
  const_iterator __begin1;
  ProString *this_00;
  QList<ProString> *this_01;
  const_iterator local_10;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_string)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->m_string)->ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->m_string)->size = -0x5555555555555556;
  this_00 = in_RDI;
  this_01 = in_RSI;
  QList<QString>::QList((QList<QString> *)0x330070);
  QList<ProString>::size(in_RSI);
  QList<QString>::reserve((QList<QString> *)this_01,asize);
  local_10.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<ProString>::begin(this_00);
  o = QList<ProString>::end(this_00);
  while (bVar1 = QList<ProString>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<ProString>::const_iterator::operator*(&local_10);
    ProString::toQString(in_RDI);
    QList<QString>::append((QList<QString> *)this_00,&in_RDI->m_string);
    QString::~QString((QString *)0x33013b);
    QList<ProString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return (QStringList *)in_RDI;
}

Assistant:

QStringList ProStringList::toQStringList() const
{
    QStringList ret;
    ret.reserve(size());
    for (const auto &e : *this)
        ret.append(e.toQString());
    return ret;
}